

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O3

int CVodeSetConstraints(void *cvode_mem,N_Vector constraints)

{
  long lVar1;
  N_Vector_Ops p_Var2;
  N_Vector z;
  int iVar3;
  int error_code;
  char *msgfmt;
  realtype rVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar3 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
  }
  else {
    if (constraints == (N_Vector)0x0) {
      if (*(int *)((long)cvode_mem + 0x468) != 0) {
        N_VDestroy(*(N_Vector *)((long)cvode_mem + 0x108));
        lVar1 = *(long *)((long)cvode_mem + 0x3b0);
        auVar5._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar5._0_8_ = lVar1;
        auVar5._12_4_ = -(uint)(lVar1 < 0);
        *(long *)((long)cvode_mem + 0x3b8) =
             *(long *)((long)cvode_mem + 0x3b8) - CONCAT44(-(uint)((int)lVar1 < 0),(int)lVar1);
        *(long *)((long)cvode_mem + 0x3c0) = *(long *)((long)cvode_mem + 0x3c0) - auVar5._8_8_;
      }
      *(undefined4 *)((long)cvode_mem + 0x468) = 0;
      *(undefined4 *)((long)cvode_mem + 0x58) = 0;
      return 0;
    }
    p_Var2 = constraints->ops;
    if ((((p_Var2->nvdiv == (_func_void_N_Vector_N_Vector_N_Vector *)0x0) ||
         (p_Var2->nvmaxnorm == (_func_realtype_N_Vector *)0x0)) ||
        (p_Var2->nvcompare == (_func_void_realtype_N_Vector_N_Vector *)0x0)) ||
       ((p_Var2->nvconstrmask == (_func_int_N_Vector_N_Vector_N_Vector *)0x0 ||
        (p_Var2->nvminquotient == (_func_realtype_N_Vector_N_Vector *)0x0)))) {
      msgfmt = "A required vector operation is not implemented.";
    }
    else {
      rVar4 = N_VMaxNorm(constraints);
      if ((rVar4 <= 2.5) && (0.5 <= rVar4)) {
        if (*(int *)((long)cvode_mem + 0x468) == 0) {
          z = N_VClone(constraints);
          *(N_Vector *)((long)cvode_mem + 0x108) = z;
          lVar1 = *(long *)((long)cvode_mem + 0x3b0);
          auVar6._8_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar6._0_8_ = lVar1;
          auVar6._12_4_ = -(uint)(lVar1 < 0);
          *(long *)((long)cvode_mem + 0x3b8) =
               *(long *)((long)cvode_mem + 0x3b8) + CONCAT44(-(uint)((int)lVar1 < 0),(int)lVar1);
          *(long *)((long)cvode_mem + 0x3c0) = *(long *)((long)cvode_mem + 0x3c0) + auVar6._8_8_;
          *(undefined4 *)((long)cvode_mem + 0x468) = 1;
        }
        else {
          z = *(N_Vector *)((long)cvode_mem + 0x108);
        }
        N_VScale(1.0,constraints,z);
        *(undefined4 *)((long)cvode_mem + 0x58) = 1;
        return 0;
      }
      msgfmt = "Illegal values in constraints vector.";
    }
    iVar3 = -0x16;
    error_code = -0x16;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,"CVODE","CVodeSetConstraints",msgfmt);
  return iVar3;
}

Assistant:

int CVodeSetConstraints(void *cvode_mem, N_Vector constraints)
{
  CVodeMem cv_mem;
  realtype temptest;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetConstraints", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  /* If there are no constraints, destroy data structures */
  if (constraints == NULL) {
    if (cv_mem->cv_constraintsMallocDone) {
      N_VDestroy(cv_mem->cv_constraints);
      cv_mem->cv_lrw -= cv_mem->cv_lrw1;
      cv_mem->cv_liw -= cv_mem->cv_liw1;
    }
    cv_mem->cv_constraintsMallocDone = SUNFALSE;
    cv_mem->cv_constraintsSet = SUNFALSE;
    return(CV_SUCCESS);
  }

  /* Test if required vector ops. are defined */

  if (constraints->ops->nvdiv         == NULL ||
      constraints->ops->nvmaxnorm     == NULL ||
      constraints->ops->nvcompare     == NULL ||
      constraints->ops->nvconstrmask  == NULL ||
      constraints->ops->nvminquotient == NULL) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetConstraints", MSGCV_BAD_NVECTOR);
    return(CV_ILL_INPUT);
  }

  /* Check the constraints vector */
  temptest = N_VMaxNorm(constraints);
  if ((temptest > TWOPT5) || (temptest < HALF)) {
    cvProcessError(cv_mem, CV_ILL_INPUT, "CVODE", "CVodeSetConstraints", MSGCV_BAD_CONSTR);
    return(CV_ILL_INPUT);
  }

  if ( !(cv_mem->cv_constraintsMallocDone) ) {
    cv_mem->cv_constraints = N_VClone(constraints);
    cv_mem->cv_lrw += cv_mem->cv_lrw1;
    cv_mem->cv_liw += cv_mem->cv_liw1;
    cv_mem->cv_constraintsMallocDone = SUNTRUE;
  }

  /* Load the constraints vector */
  N_VScale(ONE, constraints, cv_mem->cv_constraints);

  cv_mem->cv_constraintsSet = SUNTRUE;

  return(CV_SUCCESS);
}